

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::sendRawFtpMessage(FtpSession *this,string *raw_message)

{
  strand_service *this_00;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *op;
  ptr local_60;
  undefined1 local_48 [48];
  
  ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fineftp::FtpSession,void>
            ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)local_48,
             (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  ::std::__cxx11::string::string((string *)(local_48 + 0x10),(string *)raw_message);
  this_00 = (this->command_write_strand_).service_;
  local_60.h = (anon_class_48_2_3c81cf3a_for_handler_ *)local_48;
  op = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
        *)asio::asio_handler_allocate(0x50,(anon_class_48_2_3c81cf3a_for_handler_ *)local_48);
  local_60.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       asio::detail::
       completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  local_60.v = op;
  sendRawFtpMessage(std::__cxx11::string_const&)::$_0::__0
            ((__0 *)&op->handler_,(anon_class_48_2_3c81cf3a_for_handler_ *)local_48);
  local_60.p = op;
  asio::detail::strand_service::do_post
            (this_00,&(this->command_write_strand_).impl_,(operation *)op,false);
  local_60.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  local_60.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  asio::detail::
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  ::ptr::~ptr(&local_60);
  sendRawFtpMessage(std::__cxx11::string_const&)::$_0::~__0((__0 *)local_48);
  return;
}

Assistant:

void FtpSession::sendRawFtpMessage(const std::string& raw_message)
  {
    command_write_strand_.post([me = shared_from_this(), raw_message]()
                                {
                                  bool write_in_progress = !me->command_output_queue_.empty();
                                  me->command_output_queue_.push_back(raw_message);
                                  if (!write_in_progress)
                                  {
                                    me->startSendingMessages();
                                  }
                                });
  }